

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

int Abc_BufEdgeSlack(Buf_Man_t *p,Abc_Obj_t *pObj,Abc_Obj_t *pFan)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  
  iVar1 = pObj->Id;
  if ((-1 < (long)iVar1) && (iVar1 < p->vArr->nSize)) {
    iVar2 = pFan->Id;
    if ((-1 < (long)iVar2) && (iVar2 < p->vDep->nSize)) {
      iVar3 = p->DelayMax;
      iVar1 = p->vArr->pArray[iVar1];
      iVar2 = p->vDep->pArray[iVar2];
      iVar5 = Abc_NodeFindFanin(pFan,pObj);
      iVar4 = pFan->Id;
      if ((((-1 < (long)iVar4) && (iVar4 < p->vOffsets->nSize)) &&
          (uVar6 = iVar5 + p->vOffsets->pArray[iVar4], -1 < (int)uVar6)) &&
         ((int)uVar6 < p->vEdges->nSize)) {
        return iVar3 - (iVar1 + iVar2 + p->vEdges->pArray[uVar6]);
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int  Abc_BufEdgeSlack( Buf_Man_t * p, Abc_Obj_t * pObj, Abc_Obj_t * pFan ) { return p->DelayMax - Abc_BufNodeArr(p, pObj) - Abc_BufNodeDep(p, pFan) - Abc_BufEdgeDelay(p, pFan, Abc_NodeFindFanin(pFan, pObj)); }